

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O2

void embree::triangle_bounds_func(RTCBoundsFunctionArguments *args)

{
  long lVar1;
  long lVar2;
  RTCBounds *pRVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar1 = *(long *)(meshes + (ulong)*(uint *)&args->geometryUserPtr * 8);
  lVar2 = *(long *)(lVar1 + 8);
  lVar1 = *(long *)(lVar1 + 0x20);
  lVar4 = (ulong)args->primID * 0xc;
  auVar7 = *(undefined1 (*) [16])(lVar2 + (long)*(int *)(lVar1 + lVar4) * 0x10);
  auVar5 = minps(_DAT_00220060,auVar7);
  auVar6 = maxps(_DAT_00220070,auVar7);
  auVar7 = *(undefined1 (*) [16])(lVar2 + (long)*(int *)(lVar1 + 4 + lVar4) * 0x10);
  auVar5 = minps(auVar5,auVar7);
  auVar6 = maxps(auVar6,auVar7);
  auVar7 = *(undefined1 (*) [16])(lVar2 + (long)*(int *)(lVar1 + 8 + lVar4) * 0x10);
  auVar5 = minps(auVar5,auVar7);
  auVar7 = maxps(auVar6,auVar7);
  pRVar3 = args->bounds_o;
  pRVar3->lower_x = (float)auVar5._0_4_;
  pRVar3->lower_y = (float)auVar5._4_4_;
  pRVar3->lower_z = (float)auVar5._8_4_;
  pRVar3->align0 = (float)auVar5._12_4_;
  pRVar3->upper_x = (float)auVar7._0_4_;
  pRVar3->upper_y = (float)auVar7._4_4_;
  pRVar3->upper_z = (float)auVar7._8_4_;
  pRVar3->align1 = (float)auVar7._12_4_;
  return;
}

Assistant:

void triangle_bounds_func(const struct RTCBoundsFunctionArguments* args)
{
  void* ptr  = args->geometryUserPtr;
  unsigned geomID = (unsigned) (size_t) ptr;
  auto const & mesh = *meshes[geomID];
  BBox3fa bounds = empty;
  bounds.extend(mesh.x_[mesh.tris_[args->primID].v0]);
  bounds.extend(mesh.x_[mesh.tris_[args->primID].v1]);
  bounds.extend(mesh.x_[mesh.tris_[args->primID].v2]);
  *(BBox3fa*) args->bounds_o = bounds;
}